

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::
DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
findEntry(DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          *this,pair<unsigned_int,_unsigned_int> *key)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  
  if (this->_capacity == 0) {
    pEVar4 = (Entry *)0x0;
  }
  else {
    uVar2 = DefaultHash::hash<unsigned_int,unsigned_int>(key);
    uVar5 = (ulong)uVar2 % (ulong)(uint)this->_capacity;
    uVar2 = this->_entries[uVar5].field_0._infoData;
    pEVar4 = (Entry *)0x0;
    if (uVar2 >> 2 == this->_timestamp) {
      pEVar3 = this->_entries + uVar5;
      iVar8 = -(uint)((*key).first == (pEVar3->_key).first);
      iVar9 = -(uint)((*key).second == (pEVar3->_key).second);
      auVar7._4_4_ = iVar8;
      auVar7._0_4_ = iVar8;
      auVar7._8_4_ = iVar9;
      auVar7._12_4_ = iVar9;
      iVar8 = movmskpd(0,auVar7);
      if (iVar8 == 3) {
        uVar2 = uVar2 & 1;
      }
      else {
        if ((uVar2 & 2) == 0) {
          return (Entry *)0x0;
        }
        uVar2 = DefaultHash2::hash<unsigned_int,unsigned_int>(key);
        uVar2 = uVar2 % (uint)this->_capacity;
        do {
          uVar5 = (ulong)((int)uVar5 + uVar2 + (uVar2 == 0)) % (ulong)(uint)this->_capacity;
          pEVar3 = this->_entries + uVar5;
          uVar1 = this->_entries[uVar5].field_0._infoData;
          uVar6 = uVar1 >> 2;
          if (uVar6 != this->_timestamp) break;
        } while (((pEVar3->_key).first != key->first) || ((pEVar3->_key).second != key->second));
        uVar2 = uVar1 & 1 | uVar6 ^ this->_timestamp;
      }
      pEVar4 = (Entry *)0x0;
      if (uVar2 == 0) {
        pEVar4 = pEVar3;
      }
    }
  }
  return pEVar4;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }